

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_chunk_createv(ucvector *out,uint length,char *type,uchar *data)

{
  uchar *puStack_38;
  uint error;
  uchar *chunk;
  uchar *data_local;
  char *type_local;
  ucvector *puStack_18;
  uint length_local;
  ucvector *out_local;
  
  chunk = data;
  data_local = (uchar *)type;
  type_local._4_4_ = length;
  puStack_18 = out;
  out_local._4_4_ = lodepng_chunk_init(&stack0xffffffffffffffc8,out,length,type);
  if (out_local._4_4_ == 0) {
    lodepng_memcpy(puStack_38 + 8,chunk,(ulong)type_local._4_4_);
    lodepng_chunk_generate_crc(puStack_38);
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

static unsigned lodepng_chunk_createv(ucvector* out,
                                      unsigned length, const char* type, const unsigned char* data) {
  unsigned char* chunk;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, length, type));

  /*3: the data*/
  lodepng_memcpy(chunk + 8, data, length);

  /*4: CRC (of the chunkname characters and the data)*/
  lodepng_chunk_generate_crc(chunk);

  return 0;
}